

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Int24_To_Int16_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  byte bVar1;
  ushort uVar2;
  PaInt32 PVar3;
  uchar *src;
  PaInt16 *dest;
  byte *pbVar4;
  
  if (count != 0) {
    pbVar4 = (byte *)((long)sourceBuffer + 2);
    do {
      uVar2 = *(ushort *)(pbVar4 + -2);
      bVar1 = *pbVar4;
      PVar3 = PaUtil_Generate16BitTriangularDither(ditherGenerator);
      pbVar4 = pbVar4 + sourceStride * 3;
      *(short *)destinationBuffer = (short)(PVar3 + ((uint)bVar1 << 0x17 | (uint)uVar2 << 7) >> 0xf)
      ;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 2);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int24_To_Int16_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char *)sourceBuffer;
    PaInt16 *dest = (PaInt16 *)destinationBuffer;

    PaInt32 temp, dither;

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (PaInt16) (((temp >> 1) + dither) >> 15);

        src += sourceStride * 3;
        dest += destinationStride;
    }
}